

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O2

int mbedtls_xtea_self_test(int verbose)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uchar (*key) [16];
  uchar buf [8];
  mbedtls_xtea_context ctx;
  
  ctx.k[0] = 0;
  ctx.k[1] = 0;
  ctx.k[2] = 0;
  ctx.k[3] = 0;
  uVar1 = 1;
  key = xtea_test_key;
  lVar3 = 0;
  do {
    if (lVar3 == 0x30) {
      iVar2 = 0;
      if (verbose != 0) {
        putchar(10);
      }
LAB_00129f02:
      mbedtls_xtea_free(&ctx);
      return iVar2;
    }
    if (verbose != 0) {
      printf("  XTEA test #%d: ",(ulong)uVar1);
    }
    buf = *(uchar (*) [8])(xtea_test_pt[0] + lVar3);
    mbedtls_xtea_setup(&ctx,*key);
    mbedtls_xtea_crypt_ecb(&ctx,1,buf,buf);
    if (buf != *(uchar (*) [8])(xtea_test_ct[0] + lVar3)) {
      iVar2 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_00129f02;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar1 = uVar1 + 1;
    lVar3 = lVar3 + 8;
    key = key + 1;
  } while( true );
}

Assistant:

int mbedtls_xtea_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char buf[8];
    mbedtls_xtea_context ctx;

    mbedtls_xtea_init( &ctx );
    for( i = 0; i < 6; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  XTEA test #%d: ", i + 1 );

        memcpy( buf, xtea_test_pt[i], 8 );

        mbedtls_xtea_setup( &ctx, xtea_test_key[i] );
        mbedtls_xtea_crypt_ecb( &ctx, MBEDTLS_XTEA_ENCRYPT, buf, buf );

        if( memcmp( buf, xtea_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_xtea_free( &ctx );

    return( ret );
}